

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O0

uchar asc2nibble(char c)

{
  char c_local;
  undefined1 local_1;
  
  if ((c < '0') || ('9' < c)) {
    if ((c < 'A') || ('F' < c)) {
      if ((c < 'a') || ('f' < c)) {
        local_1 = '\x10';
      }
      else {
        local_1 = c + 0xa9;
      }
    }
    else {
      local_1 = c + 0xc9;
    }
  }
  else {
    local_1 = c + 0xd0;
  }
  return local_1;
}

Assistant:

unsigned char asc2nibble(char c) {

	if ((c >= '0') && (c <= '9'))
		return c - '0';

	if ((c >= 'A') && (c <= 'F'))
		return c - 'A' + 10;

	if ((c >= 'a') && (c <= 'f'))
		return c - 'a' + 10;

	return 16; /* error */
}